

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

void agc_noise(agc_t *agc,mfcc_t **cep,int32 nfr)

{
  int local_2c;
  int local_28;
  int32 noise_frames;
  int32 i;
  mfcc_t noise_level;
  mfcc_t min_energy;
  int32 nfr_local;
  mfcc_t **cep_local;
  agc_t *agc_local;
  
  i = (int32)**cep;
  for (local_28 = 0; local_28 < nfr; local_28 = local_28 + 1) {
    if ((float)*cep[local_28] < (float)i) {
      i = (int32)*cep[local_28];
    }
  }
  local_2c = 0;
  noise_frames = 0;
  for (local_28 = 0; local_28 < nfr; local_28 = local_28 + 1) {
    if ((float)*cep[local_28] < (float)agc->noise_thresh + (float)i) {
      noise_frames = (int32)((float)*cep[local_28] + (float)noise_frames);
      local_2c = local_2c + 1;
    }
  }
  if (0 < local_2c) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/agc.c"
            ,0xd1,"AGC NOISE: max= %6.3f\n",(double)((float)noise_frames / (float)local_2c));
    for (local_28 = 0; local_28 < nfr; local_28 = local_28 + 1) {
      *cep[local_28] = (mfcc_t)((float)*cep[local_28] - (float)noise_frames / (float)local_2c);
    }
  }
  return;
}

Assistant:

void
agc_noise(agc_t *agc,
          mfcc_t **cep,
          int32 nfr)
{
    mfcc_t min_energy; /* Minimum log-energy */
    mfcc_t noise_level;        /* Average noise_level */
    int32 i;           /* frame index */
    int32 noise_frames;        /* Number of noise frames */

    /* Determine minimum log-energy in utterance */
    min_energy = cep[0][0];
    for (i = 0; i < nfr; ++i) {
        if (cep[i][0] < min_energy)
            min_energy = cep[i][0];
    }

    /* Average all frames between min_energy and min_energy + agc->noise_thresh */
    noise_frames = 0;
    noise_level = 0;
    min_energy += agc->noise_thresh;
    for (i = 0; i < nfr; ++i) {
        if (cep[i][0] < min_energy) {
            noise_level += cep[i][0];
            noise_frames++;
        }
    }

    if (noise_frames > 0) {
        noise_level /= noise_frames;
        E_INFO("AGC NOISE: max= %6.3f\n", MFCC2FLOAT(noise_level));
        /* Subtract noise_level from all log_energy values */
        for (i = 0; i < nfr; i++) {
            cep[i][0] -= noise_level;
        }
    }
}